

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::BasicResourceAtomicCounter::Run(BasicResourceAtomicCounter *this)

{
  bool bVar1;
  Vector<unsigned_int,_3> local_78;
  Vector<unsigned_int,_3> local_6c;
  Vector<unsigned_int,_3> local_60;
  Vector<unsigned_int,_3> local_54;
  Vector<unsigned_int,_3> local_48;
  Vector<unsigned_int,_3> local_3c;
  Vector<unsigned_int,_3> local_30;
  Vector<unsigned_int,_3> local_24;
  BasicResourceAtomicCounter *local_18;
  BasicResourceAtomicCounter *this_local;
  
  local_18 = this;
  tcu::Vector<unsigned_int,_3>::Vector(&local_24,4,3,2);
  tcu::Vector<unsigned_int,_3>::Vector(&local_30,2,3,4);
  bVar1 = RunIteration(this,&local_24,&local_30,false);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    tcu::Vector<unsigned_int,_3>::Vector(&local_3c,1,1,1);
    tcu::Vector<unsigned_int,_3>::Vector(&local_48,1,1,1);
    bVar1 = RunIteration(this,&local_3c,&local_48,true);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      tcu::Vector<unsigned_int,_3>::Vector(&local_54,1,6,1);
      tcu::Vector<unsigned_int,_3>::Vector(&local_60,1,1,8);
      bVar1 = RunIteration(this,&local_54,&local_60,false);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        tcu::Vector<unsigned_int,_3>::Vector(&local_6c,4,1,2);
        tcu::Vector<unsigned_int,_3>::Vector(&local_78,10,3,4);
        bVar1 = RunIteration(this,&local_6c,&local_78,true);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          this_local = (BasicResourceAtomicCounter *)0x0;
        }
        else {
          this_local = (BasicResourceAtomicCounter *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (BasicResourceAtomicCounter *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (BasicResourceAtomicCounter *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (BasicResourceAtomicCounter *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!RunIteration(uvec3(4, 3, 2), uvec3(2, 3, 4), false))
			return ERROR;
		if (!RunIteration(uvec3(1, 1, 1), uvec3(1, 1, 1), true))
			return ERROR;
		if (!RunIteration(uvec3(1, 6, 1), uvec3(1, 1, 8), false))
			return ERROR;
		if (!RunIteration(uvec3(4, 1, 2), uvec3(10, 3, 4), true))
			return ERROR;
		return NO_ERROR;
	}